

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadBinaryFile(COBImporter *this,Scene *out,StreamReaderLE *reader)

{
  undefined8 uVar1;
  int8_t iVar2;
  bool bVar3;
  int16_t iVar4;
  char *pcVar5;
  undefined1 local_5c [8];
  ChunkInfo nfo;
  undefined1 local_40 [8];
  string type;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  type.field_2._8_8_ = reader;
  if (reader != (StreamReaderLE *)0x0) {
    do {
      std::__cxx11::string::string((string *)local_40);
      iVar2 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)type.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,iVar2);
      iVar2 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)type.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,iVar2);
      iVar2 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)type.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,iVar2);
      iVar2 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)type.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,iVar2);
      COB::ChunkInfo::ChunkInfo((ChunkInfo *)local_5c);
      iVar4 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)type.field_2._8_8_);
      nfo.id = iVar4 * 10;
      iVar4 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)type.field_2._8_8_);
      nfo.id = nfo.id + (int)iVar4;
      local_5c._0_4_ =
           StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)type.field_2._8_8_);
      local_5c._4_4_ =
           StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)type.field_2._8_8_);
      nfo.parent_id =
           StreamReader<false,_false>::GetI4((StreamReader<false,_false> *)type.field_2._8_8_);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"PolH");
      if (bVar3) {
        ReadPolH_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
LAB_00768f22:
        bVar3 = false;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"BitM");
        if (bVar3) {
          ReadBitM_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Grou");
        if (bVar3) {
          ReadGrou_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Lght");
        if (bVar3) {
          ReadLght_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Came");
        if (bVar3) {
          ReadCame_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Mat1");
        if (bVar3) {
          ReadMat1_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Unit");
        if (bVar3) {
          ReadUnit_Binary(this,out,(StreamReaderLE *)type.field_2._8_8_,(ChunkInfo *)local_5c);
          goto LAB_00768f22;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"OLay");
        uVar1 = type.field_2._8_8_;
        if (bVar3) {
          if (nfo.parent_id != 0xffffffff) {
            StreamReader<false,_false>::IncPtr
                      ((StreamReader<false,_false> *)type.field_2._8_8_,(ulong)nfo.parent_id);
            goto LAB_00768f22;
          }
          pcVar5 = (char *)std::__cxx11::string::c_str();
          UnsupportedChunk_Binary(this,(StreamReaderLE *)uVar1,(ChunkInfo *)local_5c,pcVar5);
          bVar3 = true;
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"END ");
          uVar1 = type.field_2._8_8_;
          if (!bVar3) {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            UnsupportedChunk_Binary(this,(StreamReaderLE *)uVar1,(ChunkInfo *)local_5c,pcVar5);
            goto LAB_00768f22;
          }
          bVar3 = true;
        }
      }
      std::__cxx11::string::~string((string *)local_40);
    } while (!bVar3);
  }
  return;
}

Assistant:

void COBImporter::ReadBinaryFile(Scene& out, StreamReaderLE* reader) {
    if (nullptr == reader) {
        return;
    }

    while(1) {
        std::string type;
         type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ;

        ChunkInfo nfo;
        nfo.version  = reader -> GetI2()*10;
        nfo.version += reader -> GetI2();

        nfo.id = reader->GetI4();
        nfo.parent_id = reader->GetI4();
        nfo.size = reader->GetI4();

        if (type == "PolH") {
            ReadPolH_Binary(out,*reader,nfo);
        }
        else if (type == "BitM") {
            ReadBitM_Binary(out,*reader,nfo);
        }
        else if (type == "Grou") {
            ReadGrou_Binary(out,*reader,nfo);
        }
        else if (type == "Lght") {
            ReadLght_Binary(out,*reader,nfo);
        }
        else if (type == "Came") {
            ReadCame_Binary(out,*reader,nfo);
        }
        else if (type == "Mat1") {
            ReadMat1_Binary(out,*reader,nfo);
        }
    /*  else if (type == "Bone") {
            ReadBone_Binary(out,*reader,nfo);
        }
        else if (type == "Chan") {
            ReadChan_Binary(out,*reader,nfo);
        }*/
        else if (type == "Unit") {
            ReadUnit_Binary(out,*reader,nfo);
        }
        else if (type == "OLay") {
            // ignore layer index silently.
            if(nfo.size != static_cast<unsigned int>(-1) ) {
                reader->IncPtr(nfo.size);
            }
            else return UnsupportedChunk_Binary(*reader,nfo,type.c_str());
        }
        else if (type == "END ") {
            return;
        }
        else UnsupportedChunk_Binary(*reader,nfo,type.c_str());
    }
}